

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

const_iterator * __thiscall
Catch::TextFlow::Column::const_iterator::operator++(const_iterator *this)

{
  bool bVar1;
  bool bVar2;
  char cVar3;
  const_iterator *in_RDI;
  const_iterator *in_stack_00000010;
  AnsiSkippingString *current_line;
  const_iterator *in_stack_ffffffffffffff78;
  AnsiSkippingString *in_stack_ffffffffffffff80;
  const_iterator *this_00;
  bool local_69;
  
  (in_RDI->m_lineStart).m_string = (in_RDI->m_lineEnd).m_string;
  (in_RDI->m_lineStart).m_it._M_current = (in_RDI->m_lineEnd).m_it._M_current;
  AnsiSkippingString::end(in_stack_ffffffffffffff80);
  bVar1 = AnsiSkippingString::const_iterator::operator!=
                    ((const_iterator *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  bVar2 = false;
  if (bVar1) {
    cVar3 = AnsiSkippingString::const_iterator::operator*((const_iterator *)0x19700d);
    bVar2 = cVar3 == '\n';
  }
  if (bVar2) {
    AnsiSkippingString::const_iterator::operator++(in_stack_ffffffffffffff78,0);
  }
  else {
    while( true ) {
      AnsiSkippingString::end(in_stack_ffffffffffffff80);
      bVar2 = AnsiSkippingString::const_iterator::operator!=
                        ((const_iterator *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      local_69 = false;
      if (bVar2) {
        cVar3 = AnsiSkippingString::const_iterator::operator*((const_iterator *)0x197090);
        local_69 = anon_unknown.dwarf_18d5be::isWhitespace(cVar3);
      }
      if (local_69 == false) break;
      AnsiSkippingString::const_iterator::operator++((const_iterator *)in_stack_ffffffffffffff80);
    }
  }
  this_00 = &in_RDI->m_lineStart;
  AnsiSkippingString::end((AnsiSkippingString *)this_00);
  bVar2 = AnsiSkippingString::const_iterator::operator!=(this_00,in_stack_ffffffffffffff78);
  if (bVar2) {
    calcLength(in_stack_00000010);
  }
  return in_RDI;
}

Assistant:

Column::const_iterator& Column::const_iterator::operator++() {
            m_lineStart = m_lineEnd;
            AnsiSkippingString const& current_line = m_column.m_string;
            if ( m_lineStart != current_line.end() && *m_lineStart == '\n' ) {
                m_lineStart++;
            } else {
                while ( m_lineStart != current_line.end() &&
                        isWhitespace( *m_lineStart ) ) {
                    ++m_lineStart;
                }
            }

            if ( m_lineStart != current_line.end() ) { calcLength(); }
            return *this;
        }